

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_color_picker
               (nk_command_buffer *o,nk_rect *matrix,nk_rect *hue_bar,nk_rect *alpha_bar,
               nk_colorf col)

{
  nk_colorf in;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  float *in_RCX;
  float *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM1_Qa;
  float V;
  float S;
  nk_vec2 p;
  float alpha;
  int i;
  float line_y;
  float hsva [4];
  nk_color temp;
  float crosshair_size;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  float in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff44;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  nk_color in_stack_ffffffffffffff54;
  nk_color in_stack_ffffffffffffff58;
  nk_color in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined8 uVar4;
  nk_color c;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float fVar5;
  int local_50;
  float local_48;
  nk_color nStack_4;
  
  in.g = in_stack_ffffffffffffff3c;
  in.r = in_stack_ffffffffffffff38;
  in.b = in_stack_ffffffffffffff40;
  in.a = in_stack_ffffffffffffff44;
  nk_colorf_hsva_fv((float *)0x159bb3,in);
  nStack_4 = in_stack_ffffffffffffff54;
  for (local_50 = 0; local_50 < 6; local_50 = local_50 + 1) {
    nk_rect(*in_RDX,(float)local_50 * (in_RDX[3] / 6.0) + in_RDX[1] + 0.5,in_RDX[2],
            in_RDX[3] / 6.0 + 0.5);
    rect.y = (float)in_stack_ffffffffffffff6c;
    rect.x = (float)in_stack_ffffffffffffff68;
    rect.w = (float)in_stack_ffffffffffffff70;
    rect.h = in_stack_ffffffffffffff74;
    nk_fill_rect_multi_color
              ((nk_command_buffer *)CONCAT44(nStack_4,in_stack_ffffffffffffff50),rect,
               SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0),SUB84(in_stack_ffffffffffffff60,0),
               in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  }
  fVar1 = (float)(int)(local_48 * *(float *)(in_RSI + 0xc) + in_RDX[1] + 0.5);
  fVar2 = *in_RDX - 1.0;
  fVar3 = *in_RDX + in_RDX[2] + 2.0;
  uVar4 = in_RDI;
  fVar5 = fVar1;
  nk_rgb(0xff,0xff,0xff);
  nk_stroke_line((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (float)nStack_4,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,SUB84((ulong)uVar4 >> 0x20,0));
  if (in_RCX != (float *)0x0) {
    nStack_4 = SUB84((ulong)in_XMM1_Qa >> 0x20,0);
    in_stack_ffffffffffffff5c = nStack_4;
    if (1.0 < (float)nStack_4) {
      in_stack_ffffffffffffff5c.r = '\0';
      in_stack_ffffffffffffff5c.g = '\0';
      in_stack_ffffffffffffff5c.b = 0x80;
      in_stack_ffffffffffffff5c.a = '?';
    }
    if ((float)in_stack_ffffffffffffff5c <= 0.0) {
      nStack_4.r = '\0';
      nStack_4.g = '\0';
      nStack_4.b = '\0';
      nStack_4.a = '\0';
    }
    else {
      in_stack_ffffffffffffff58 = nStack_4;
      if (1.0 < (float)nStack_4) {
        nStack_4.r = '\0';
        nStack_4.g = '\0';
        nStack_4.b = 0x80;
        nStack_4.a = '?';
        in_stack_ffffffffffffff58 = nStack_4;
      }
    }
    in_stack_ffffffffffffff48 =
         (float)(int)((1.0 - (float)nStack_4) * *(float *)(in_RSI + 0xc) + in_RCX[1] + 0.5);
    rect_00.y = fVar1;
    rect_00.x = fVar2;
    rect_00.w = fVar3;
    rect_00.h = fVar5;
    nk_fill_rect_multi_color
              ((nk_command_buffer *)CONCAT44(nStack_4,in_stack_ffffffffffffff50),rect_00,
               SUB84((ulong)uVar4 >> 0x20,0),SUB84(uVar4,0),in_stack_ffffffffffffff5c,
               in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff38 = (float)in_RDI;
    in_stack_ffffffffffffff3c = (float)((ulong)in_RDI >> 0x20);
    in_stack_ffffffffffffff44 = *in_RCX - 1.0;
    in_stack_ffffffffffffff4c = *in_RCX + in_RCX[2] + 2.0;
    in_stack_ffffffffffffff50 = in_stack_ffffffffffffff48;
    nk_rgb(0xff,0xff,0xff);
    nk_stroke_line((nk_command_buffer *)
                   CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),(float)nStack_4,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                   in_stack_ffffffffffffff44,SUB84((ulong)uVar4 >> 0x20,0));
  }
  nk_hsv_f(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
  rect_01.y = fVar1;
  rect_01.x = fVar2;
  rect_01.w = fVar3;
  rect_01.h = fVar5;
  nk_fill_rect_multi_color
            ((nk_command_buffer *)CONCAT44(nStack_4,in_stack_ffffffffffffff50),rect_01,
             SUB84((ulong)uVar4 >> 0x20,0),SUB84(uVar4,0),in_stack_ffffffffffffff5c,
             in_stack_ffffffffffffff58);
  rect_02.y = fVar1;
  rect_02.x = fVar2;
  rect_02.w = fVar3;
  rect_02.h = fVar5;
  nk_fill_rect_multi_color
            ((nk_command_buffer *)CONCAT44(nStack_4,in_stack_ffffffffffffff50),rect_02,
             SUB84((ulong)uVar4 >> 0x20,0),SUB84(uVar4,0),in_stack_ffffffffffffff5c,
             in_stack_ffffffffffffff58);
  c = SUB84((ulong)uVar4 >> 0x20,0);
  nk_stroke_line((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (float)nStack_4,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,c);
  nk_stroke_line((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (float)nStack_4,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,c);
  nk_stroke_line((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (float)nStack_4,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,c);
  nk_stroke_line((nk_command_buffer *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (float)nStack_4,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,c);
  return;
}

Assistant:

NK_LIB void
nk_draw_color_picker(struct nk_command_buffer *o, const struct nk_rect *matrix,
const struct nk_rect *hue_bar, const struct nk_rect *alpha_bar,
struct nk_colorf col)
{
NK_STORAGE const struct nk_color black = {0,0,0,255};
NK_STORAGE const struct nk_color white = {255, 255, 255, 255};
NK_STORAGE const struct nk_color black_trans = {0,0,0,0};

const float crosshair_size = 7.0f;
struct nk_color temp;
float hsva[4];
float line_y;
int i;

NK_ASSERT(o);
NK_ASSERT(matrix);
NK_ASSERT(hue_bar);

/* draw hue bar */
nk_colorf_hsva_fv(hsva, col);
for (i = 0; i < 6; ++i) {
NK_GLOBAL const struct nk_color hue_colors[] = {
{255, 0, 0, 255}, {255,255,0,255}, {0,255,0,255}, {0, 255,255,255},
{0,0,255,255}, {255, 0, 255, 255}, {255, 0, 0, 255}
};
nk_fill_rect_multi_color(o,
nk_rect(hue_bar->x, hue_bar->y + (float)i * (hue_bar->h/6.0f) + 0.5f,
hue_bar->w, (hue_bar->h/6.0f) + 0.5f), hue_colors[i], hue_colors[i],
hue_colors[i+1], hue_colors[i+1]);
}
line_y = (float)(int)(hue_bar->y + hsva[0] * matrix->h + 0.5f);
nk_stroke_line(o, hue_bar->x-1, line_y, hue_bar->x + hue_bar->w + 2,
line_y, 1, nk_rgb(255,255,255));

/* draw alpha bar */
if (alpha_bar) {
float alpha = NK_SATURATE(col.a);
line_y = (float)(int)(alpha_bar->y +  (1.0f - alpha) * matrix->h + 0.5f);

nk_fill_rect_multi_color(o, *alpha_bar, white, white, black, black);
nk_stroke_line(o, alpha_bar->x-1, line_y, alpha_bar->x + alpha_bar->w + 2,
line_y, 1, nk_rgb(255,255,255));
}

/* draw color matrix */
temp = nk_hsv_f(hsva[0], 1.0f, 1.0f);
nk_fill_rect_multi_color(o, *matrix, white, temp, temp, white);
nk_fill_rect_multi_color(o, *matrix, black_trans, black_trans, black, black);

/* draw cross-hair */
{struct nk_vec2 p; float S = hsva[1]; float V = hsva[2];
p.x = (float)(int)(matrix->x + S * matrix->w);
p.y = (float)(int)(matrix->y + (1.0f - V) * matrix->h);
nk_stroke_line(o, p.x - crosshair_size, p.y, p.x-2, p.y, 1.0f, white);
nk_stroke_line(o, p.x + crosshair_size + 1, p.y, p.x+3, p.y, 1.0f, white);
nk_stroke_line(o, p.x, p.y + crosshair_size + 1, p.x, p.y+3, 1.0f, white);
nk_stroke_line(o, p.x, p.y - crosshair_size, p.x, p.y-2, 1.0f, white);}
}